

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketServer.cpp
# Opt level: O1

void __thiscall
FIX::ServerWrapper::onEvent(ServerWrapper *this,SocketMonitor *monitor,socket_handle socket)

{
  _Rb_tree_header *p_Var1;
  SocketServer *this_00;
  Strategy *pSVar2;
  uint uVar3;
  int iVar4;
  _Base_ptr __addr_len;
  _Base_ptr p_Var5;
  
  p_Var1 = &(this->m_sockets)._M_t._M_impl.super__Rb_tree_header;
  p_Var5 = (this->m_sockets)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  __addr_len = &p_Var1->_M_header;
  for (; p_Var5 != (_Base_ptr)0x0; p_Var5 = (&p_Var5->_M_left)[(int)p_Var5[1]._M_color < socket]) {
    if (socket <= (int)p_Var5[1]._M_color) {
      __addr_len = p_Var5;
    }
  }
  p_Var5 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)__addr_len != p_Var1) &&
     (p_Var5 = __addr_len, socket < (int)__addr_len[1]._M_color)) {
    __addr_len = &p_Var1->_M_header;
    p_Var5 = &p_Var1->_M_header;
  }
  this_00 = this->m_server;
  pSVar2 = this->m_strategy;
  if ((_Rb_tree_header *)p_Var5 != p_Var1) {
    uVar3 = SocketServer::accept(this_00,socket,(sockaddr *)p_Var5,&__addr_len->_M_color);
    (*pSVar2->_vptr_Strategy[2])
              (pSVar2,this_00,(ulong)(uint)socket,(ulong)uVar3,pSVar2->_vptr_Strategy[2]);
    return;
  }
  iVar4 = (*pSVar2->_vptr_Strategy[4])(pSVar2,this_00,(ulong)(uint)socket);
  if ((char)iVar4 != '\0') {
    return;
  }
  (*(this->super_Strategy)._vptr_Strategy[5])(this,monitor,(ulong)(uint)socket);
  return;
}

Assistant:

void onEvent( SocketMonitor& monitor, socket_handle socket )
  {
    if( m_sockets.find(socket) != m_sockets.end() )
    {
      m_strategy.onConnect( m_server, socket, m_server.accept(socket) );
    }
    else
    {
      if( !m_strategy.onData( m_server, socket ) )
        onError( monitor, socket );
    }
  }